

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMeshTextureAlias
          (OgreBinarySerializer *this,SubMesh *submesh)

{
  string sStack_38;
  
  ReadLine_abi_cxx11_(&sStack_38,this);
  std::__cxx11::string::operator=
            ((string *)&(submesh->super_ISubMesh).textureAliasName,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  ReadLine_abi_cxx11_(&sStack_38,this);
  std::__cxx11::string::operator=
            ((string *)&(submesh->super_ISubMesh).textureAliasRef,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSubMeshTextureAlias(SubMesh *submesh)
{
    submesh->textureAliasName = ReadLine();
    submesh->textureAliasRef = ReadLine();
}